

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

char * lua_pushlstring(lua_State *L,char *s,size_t len)

{
  StkId pTVar1;
  TString *pTVar2;
  
  if (len == 0) {
    pTVar2 = luaS_new(L,"");
  }
  else {
    pTVar2 = luaS_newlstr(L,s,len);
  }
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)pTVar2;
  pTVar1->tt_ = pTVar2->tt | 0x40;
  L->top = L->top + 1;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  return (char *)(pTVar2 + 1);
}

Assistant:

LUA_API const char *lua_pushlstring (lua_State *L, const char *s, size_t len) {
  TString *ts;
  lua_lock(L);
  ts = (len == 0) ? luaS_new(L, "") : luaS_newlstr(L, s, len);
  setsvalue2s(L, L->top, ts);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return getstr(ts);
}